

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.hpp
# Opt level: O0

void __thiscall libtorrent::aux::packet_buffer::packet_buffer(packet_buffer *this)

{
  packet_buffer *this_local;
  
  unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
  ::unique_ptr(&this->m_storage);
  this->m_capacity = 0;
  this->m_size = 0;
  this->m_first = 0;
  this->m_last = 0;
  return;
}

Assistant:

class TORRENT_EXTRA_EXPORT packet_buffer
	{
	public:
		using index_type = std::uint32_t;

		packet_ptr insert(index_type idx, packet_ptr value);

		int size() const { return m_size; }

		bool empty() const { return m_size == 0; }

		std::uint32_t capacity() const
		{ return m_capacity; }

		packet* at(index_type idx) const;

		packet_ptr remove(index_type idx);

		void reserve(std::uint32_t size);

		index_type cursor() const { return m_first; }

		index_type span() const { return (m_last - m_first) & 0xffff; }

#if TORRENT_USE_INVARIANT_CHECKS
		void check_invariant() const;
#endif

	private:
		aux::unique_ptr<packet_ptr[], index_type> m_storage;
		std::uint32_t m_capacity = 0;

		// this is the total number of elements that are occupied
		// in the array
		int m_size = 0;

		// This defines the first index that is part of the m_storage.
		// last is one passed the last used slot
		index_type m_first{0};
		index_type m_last{0};
	}